

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  uint16_t uVar1;
  int iVar2;
  char *in_RSI;
  int in_EDI;
  socklen_t sinLength;
  sockaddr_in sin;
  socklen_t local_24;
  sockaddr local_20;
  char *local_10;
  int local_4;
  
  local_24 = 0x10;
  local_10 = in_RSI;
  iVar2 = getsockname(in_EDI,&local_20,&local_24);
  if (iVar2 == -1) {
    local_4 = -1;
  }
  else {
    *(undefined4 *)local_10 = local_20.sa_data._2_4_;
    uVar1 = ntohs(local_20.sa_data._0_2_);
    *(uint16_t *)(local_10 + 4) = uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_socket_get_address (ENetSocket socket, ENetAddress * address)
{
    struct sockaddr_in sin;
    socklen_t sinLength = sizeof (struct sockaddr_in);

    if (getsockname (socket, (struct sockaddr *) & sin, & sinLength) == -1)
      return -1;

    address -> host = (enet_uint32) sin.sin_addr.s_addr;
    address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);

    return 0;
}